

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::ParseSimpleBlock(Cluster *this,longlong block_size,longlong *pos,long *len)

{
  int iVar1;
  IMkvReader *pReader_00;
  Cluster *in_RCX;
  long pos_00;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int lacing;
  uchar flags;
  longlong track;
  longlong result;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong block_stop;
  longlong block_start;
  byte local_69;
  long *in_stack_ffffffffffffff98;
  longlong in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffb0;
  IMkvReader *in_stack_ffffffffffffffb8;
  long *size;
  long id;
  IMkvReader *local_8;
  
  id = *in_RDX;
  pos_00 = *in_RDX + in_RSI;
  size = *(long **)*in_RDI;
  iVar1 = (**(code **)(*size + 8))(size,&stack0xffffffffffffffb8,&stack0xffffffffffffffb0);
  pReader_00 = (IMkvReader *)(long)iVar1;
  local_8 = pReader_00;
  if (-1 < (long)pReader_00) {
    if (in_stack_ffffffffffffffb0 < *in_RDX + 1) {
      in_RCX->m_pSegment = (Segment *)0x1;
      local_8 = (IMkvReader *)0xfffffffffffffffd;
    }
    else {
      local_8 = (IMkvReader *)
                GetUIntLength(pReader_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (-1 < (long)local_8) {
        if ((long)local_8 < 1) {
          if (pos_00 < (long)&in_RCX->m_pSegment->m_pReader + *in_RDX) {
            local_8 = (IMkvReader *)0xfffffffffffffffe;
          }
          else if (in_stack_ffffffffffffffb0 < (long)&in_RCX->m_pSegment->m_pReader + *in_RDX) {
            local_8 = (IMkvReader *)0xfffffffffffffffd;
          }
          else {
            local_8 = (IMkvReader *)
                      ReadUInt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                               (long *)pReader_00);
            if (-1 < (long)local_8) {
              if (local_8 == (IMkvReader *)0x0) {
                local_8 = (IMkvReader *)0xfffffffffffffffe;
              }
              else {
                *in_RDX = (long)&in_RCX->m_pSegment->m_pReader + *in_RDX;
                if (pos_00 < *in_RDX + 2) {
                  local_8 = (IMkvReader *)0xfffffffffffffffe;
                }
                else if (in_stack_ffffffffffffffb0 < *in_RDX + 2) {
                  in_RCX->m_pSegment = (Segment *)0x2;
                  local_8 = (IMkvReader *)0xfffffffffffffffd;
                }
                else {
                  *in_RDX = *in_RDX + 2;
                  if (pos_00 < *in_RDX + 1) {
                    local_8 = (IMkvReader *)0xfffffffffffffffe;
                  }
                  else if (in_stack_ffffffffffffffb0 < *in_RDX + 1) {
                    in_RCX->m_pSegment = (Segment *)0x1;
                    local_8 = (IMkvReader *)0xfffffffffffffffd;
                  }
                  else {
                    iVar1 = (**(code **)*size)(size,*in_RDX,1,&local_69);
                    if ((long)iVar1 < 0) {
                      in_RCX->m_pSegment = (Segment *)0x1;
                      local_8 = (IMkvReader *)(long)iVar1;
                    }
                    else {
                      *in_RDX = *in_RDX + 1;
                      if (*in_RDX < pos_00) {
                        if (((int)(local_69 & 6) >> 1 == 0) || (pos_00 <= in_stack_ffffffffffffffb0)
                           ) {
                          local_8 = (IMkvReader *)
                                    CreateBlock(in_RCX,id,pos_00,(longlong)size,
                                                (longlong)in_stack_ffffffffffffffb8);
                          if (local_8 == (IMkvReader *)0x0) {
                            in_RDI[3] = pos_00;
                            local_8 = (IMkvReader *)0x0;
                          }
                        }
                        else {
                          in_RCX->m_pSegment = (Segment *)(pos_00 - *in_RDX);
                          local_8 = (IMkvReader *)0xfffffffffffffffd;
                        }
                      }
                      else {
                        local_8 = (IMkvReader *)0xfffffffffffffffe;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_8 = (IMkvReader *)0xfffffffffffffffd;
        }
      }
    }
  }
  return (long)local_8;
}

Assistant:

long Cluster::ParseSimpleBlock(long long block_size, long long& pos,
                               long& len) {
  const long long block_start = pos;
  const long long block_stop = pos + block_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  // parse track number

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // weird
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long track = ReadUInt(pReader, pos, len);

  if (track < 0)  // error
    return static_cast<long>(track);

  if (track == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((pos + 2) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 2) > avail) {
    len = 2;
    return E_BUFFER_NOT_FULL;
  }

  pos += 2;  // consume timecode

  if ((pos + 1) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  unsigned char flags;

  status = pReader->Read(pos, 1, &flags);

  if (status < 0) {  // error or underflow
    len = 1;
    return status;
  }

  ++pos;  // consume flags byte
  assert(pos <= avail);

  if (pos >= block_stop)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(flags & 0x06) >> 1;

  if ((lacing != 0) && (block_stop > avail)) {
    len = static_cast<long>(block_stop - pos);
    return E_BUFFER_NOT_FULL;
  }

  status = CreateBlock(libwebm::kMkvSimpleBlock, block_start, block_size,
                       0);  // DiscardPadding

  if (status != 0)
    return status;

  m_pos = block_stop;

  return 0;  // success
}